

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O2

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<double,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  bool bVar1;
  int i;
  ulong uVar2;
  byte bVar3;
  long *out_value_00;
  ulong uVar4;
  double *pdVar5;
  double in_value;
  double local_38;
  
  pdVar5 = (double *)
           ((this->buffer_->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start +
           this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
  uVar4 = 0;
  out_value_00 = out_value;
  while( true ) {
    bVar3 = this->num_components_;
    uVar2 = (ulong)bVar3;
    if (out_num_components <= bVar3) {
      bVar3 = out_num_components;
    }
    if (bVar3 <= uVar4) goto LAB_00154cfa;
    if ((this->buffer_->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish <= pdVar5) break;
    local_38 = *pdVar5;
    bVar1 = ConvertComponentValue<double,long>(&local_38,this->normalized_,out_value_00);
    if (!bVar1) break;
    pdVar5 = pdVar5 + 1;
    uVar4 = uVar4 + 1;
    out_value_00 = out_value_00 + 1;
  }
LAB_00154d09:
  return bVar3 <= uVar4;
LAB_00154cfa:
  for (; uVar2 < out_num_components; uVar2 = uVar2 + 1) {
    out_value[uVar2] = 0;
  }
  goto LAB_00154d09;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }